

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O0

FT_Fixed ft_trig_downscale(FT_Fixed val)

{
  ulong local_20;
  int local_14;
  long lStack_10;
  FT_Int s;
  FT_Fixed val_local;
  
  local_14 = 1;
  lStack_10 = val;
  if (val < 0) {
    lStack_10 = -val;
    local_14 = -1;
  }
  local_20 = lStack_10 * 0xdbd95b16 + 0x40000000U >> 0x20;
  if (local_14 < 0) {
    local_20 = -local_20;
  }
  return local_20;
}

Assistant:

static FT_Fixed
  ft_trig_downscale( FT_Fixed  val )
  {
    FT_Int  s = 1;


    if ( val < 0 )
    {
       val = -val;
       s = -1;
    }

    /* 0x40000000 comes from regression analysis between true */
    /* and CORDIC hypotenuse, so it minimizes the error       */
    val = (FT_Fixed)(
            ( (FT_UInt64)val * FT_TRIG_SCALE + 0x40000000UL ) >> 32 );

    return s < 0 ? -val : val;
  }